

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::SampleQualifierRenderCase::
genFragmentSource_abi_cxx11_(string *__return_storage_ptr__,void *this,int numTargetSamples)

{
  RenderContext *pRVar1;
  ContextType local_1cc;
  string local_1c8;
  undefined1 local_198 [8];
  ostringstream buf;
  int numTargetSamples_local;
  SampleQualifierRenderCase *this_local;
  
  buf._372_4_ = numTargetSamples;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::operator<<((ostream *)local_198,
                  "${GLSL_VERSION_DECL}\n${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}");
  if (*(int *)((long)this + 0xbc) == 0) {
    std::operator<<((ostream *)local_198,"sample in highp float v_input;\n");
  }
  else if (*(int *)((long)this + 0xbc) == 1) {
    std::operator<<((ostream *)local_198,"sample in highp vec2 v_input;\n");
  }
  else if (*(int *)((long)this + 0xbc) == 2) {
    std::operator<<((ostream *)local_198,"sample in highp vec3 v_input;\n");
  }
  else if (*(int *)((long)this + 0xbc) == 3) {
    std::operator<<((ostream *)local_198,"sample in highp vec4 v_input;\n");
  }
  else if (*(int *)((long)this + 0xbc) == 4) {
    std::operator<<((ostream *)local_198,"sample in highp float[2] v_input;\n");
  }
  else if (*(int *)((long)this + 0xbc) == 5) {
    std::operator<<((ostream *)local_198,
                    "struct VaryingStruct { highp float a; highp float b; };\nsample in VaryingStruct v_input;\n"
                   );
  }
  std::operator<<((ostream *)local_198,
                  "layout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n");
  if (*(int *)((long)this + 0xbc) == 0) {
    std::operator<<((ostream *)local_198,"\thighp float field = exp(v_input) + v_input*v_input;\n");
  }
  else if (*(int *)((long)this + 0xbc) == 1) {
    std::operator<<((ostream *)local_198,
                    "\thighp float field = dot(v_input.xy, v_input.xy) + dot(21.0 * v_input.xx, sin(3.1 * v_input.xy));\n"
                   );
  }
  else if (*(int *)((long)this + 0xbc) == 2) {
    std::operator<<((ostream *)local_198,
                    "\thighp float field = dot(v_input.xy, v_input.xy) + dot(21.0 * v_input.zx, sin(3.1 * v_input.zy));\n"
                   );
  }
  else if (*(int *)((long)this + 0xbc) == 3) {
    std::operator<<((ostream *)local_198,
                    "\thighp float field = dot(v_input.xy, v_input.zw) + dot(21.0 * v_input.zy, sin(3.1 * v_input.zw));\n"
                   );
  }
  else if (*(int *)((long)this + 0xbc) == 4) {
    std::operator<<((ostream *)local_198,
                    "\thighp float field = dot(vec2(v_input[0], v_input[1]), vec2(v_input[0], v_input[1])) + dot(21.0 * vec2(v_input[0]), sin(3.1 * vec2(v_input[0], v_input[1])));\n"
                   );
  }
  else if (*(int *)((long)this + 0xbc) == 5) {
    std::operator<<((ostream *)local_198,
                    "\thighp float field = dot(vec2(v_input.a, v_input.b), vec2(v_input.a, v_input.b)) + dot(21.0 * vec2(v_input.a), sin(3.1 * vec2(v_input.a, v_input.b)));\n"
                   );
  }
  std::operator<<((ostream *)local_198,
                  "\tfragColor = vec4(1.0, 1.0, 1.0, 1.0);\n\n\tif (fract(field) > 0.5)\n\t\tfragColor = vec4(0.0, 0.0, 0.0, 1.0);\n}"
                 );
  std::__cxx11::ostringstream::str();
  pRVar1 = gles31::Context::getRenderContext(*(Context **)((long)this + 0x70));
  local_1cc.super_ApiType.m_bits = (ApiType)(*pRVar1->_vptr_RenderContext[2])();
  anon_unknown_2::specializeShader(__return_storage_ptr__,&local_1c8,&local_1cc);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string	SampleQualifierRenderCase::genFragmentSource (int numTargetSamples) const
{
	DE_UNREF(numTargetSamples);

	std::ostringstream buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}";

	if (m_iteration == 0)
		buf << "sample in highp float v_input;\n";
	else if (m_iteration == 1)
		buf << "sample in highp vec2 v_input;\n";
	else if (m_iteration == 2)
		buf << "sample in highp vec3 v_input;\n";
	else if (m_iteration == 3)
		buf << "sample in highp vec4 v_input;\n";
	else if (m_iteration == 4)
		buf << "sample in highp float[2] v_input;\n";
	else if (m_iteration == 5)
		buf << "struct VaryingStruct { highp float a; highp float b; };\n"
			   "sample in VaryingStruct v_input;\n";
	else
		DE_ASSERT(false);

	buf <<	"layout(location = 0) out mediump vec4 fragColor;\n"
			"void main (void)\n"
			"{\n";

	if (m_iteration == 0)
		buf << "	highp float field = exp(v_input) + v_input*v_input;\n";
	else if (m_iteration == 1)
		buf << "	highp float field = dot(v_input.xy, v_input.xy) + dot(21.0 * v_input.xx, sin(3.1 * v_input.xy));\n";
	else if (m_iteration == 2)
		buf << "	highp float field = dot(v_input.xy, v_input.xy) + dot(21.0 * v_input.zx, sin(3.1 * v_input.zy));\n";
	else if (m_iteration == 3)
		buf << "	highp float field = dot(v_input.xy, v_input.zw) + dot(21.0 * v_input.zy, sin(3.1 * v_input.zw));\n";
	else if (m_iteration == 4)
		buf << "	highp float field = dot(vec2(v_input[0], v_input[1]), vec2(v_input[0], v_input[1])) + dot(21.0 * vec2(v_input[0]), sin(3.1 * vec2(v_input[0], v_input[1])));\n";
	else if (m_iteration == 5)
		buf << "	highp float field = dot(vec2(v_input.a, v_input.b), vec2(v_input.a, v_input.b)) + dot(21.0 * vec2(v_input.a), sin(3.1 * vec2(v_input.a, v_input.b)));\n";
	else
		DE_ASSERT(false);

	buf <<	"	fragColor = vec4(1.0, 1.0, 1.0, 1.0);\n"
			"\n"
			"	if (fract(field) > 0.5)\n"
			"		fragColor = vec4(0.0, 0.0, 0.0, 1.0);\n"
			"}";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}